

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O0

bool __thiscall
duckdb::StrpTimeFormat::TryParseDate
          (StrpTimeFormat *this,string_t input,date_t *result,string *error_message)

{
  string_t input_00;
  bool bVar1;
  undefined8 in_RDX;
  ParseResult *in_RSI;
  ParseResult *in_RDI;
  string *in_R8;
  ParseResult parse_result;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  undefined4 in_stack_ffffffffffffff04;
  undefined1 strict;
  ParseResult *in_stack_ffffffffffffff08;
  ParseResult *in_stack_ffffffffffffff10;
  anon_union_16_2_67f50693_for_value in_stack_ffffffffffffff18;
  ParseResult *format_specifier;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar2;
  
  strict = (undefined1)((uint)in_stack_ffffffffffffff04 >> 0x18);
  format_specifier = in_RDI;
  ParseResult::ParseResult(in_stack_ffffffffffffff10);
  bVar1 = Parse((StrpTimeFormat *)in_stack_ffffffffffffff10,(string_t)in_stack_ffffffffffffff18,
                in_stack_ffffffffffffff08,(bool)strict);
  if (bVar1) {
    bVar2 = ParseResult::TryToDate
                      (in_RDI,(date_t *)
                              CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  }
  else {
    input_00.value._8_7_ = in_stack_fffffffffffffff8;
    input_00.value._0_8_ = in_RDX;
    input_00.value.inlined.inlined[0xb] = in_stack_ffffffffffffffff;
    ParseResult::FormatError(in_RSI,input_00,(string *)format_specifier);
    ::std::__cxx11::string::operator=(in_R8,(string *)&stack0xffffffffffffff18);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
    bVar2 = false;
  }
  ParseResult::~ParseResult(in_RDI);
  return (bool)(bVar2 & 1);
}

Assistant:

bool StrpTimeFormat::TryParseDate(string_t input, date_t &result, string &error_message) const {
	ParseResult parse_result;
	if (!Parse(input, parse_result)) {
		error_message = parse_result.FormatError(input, format_specifier);
		return false;
	}
	return parse_result.TryToDate(result);
}